

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadSubdivMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this_00;
  XML *pXVar1;
  string *psVar2;
  XML *this_01;
  void *pvVar3;
  undefined8 uVar4;
  bool bVar5;
  RTCSubdivisionMode RVar6;
  SubdivMeshNode *this_02;
  size_t in_RCX;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *sig;
  ulong uVar7;
  uchar *in_R8;
  size_t in_R9;
  Ref<embree::XML> animation;
  Ref<embree::XML> animation_1;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> local_b0;
  string local_a8;
  undefined1 local_88 [40];
  undefined8 *local_60;
  undefined1 local_58 [32];
  XMLLoader *local_38;
  
  psVar2 = (string *)*in_RDX;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_60 = in_RDX;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"material","");
  XML::child((XML *)local_88,psVar2);
  loadMaterial((XMLLoader *)(local_58 + 0x18),xml);
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  this_02 = (SubdivMeshNode *)operator_new(0x1b0);
  local_58._16_8_ = local_58._24_8_;
  local_58._8_8_ = this_02;
  if ((long *)local_58._24_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._24_8_ + 0x10))();
  }
  SceneGraph::SubdivMeshNode::SubdivMeshNode
            (this_02,(Ref<embree::SceneGraph::MaterialNode> *)(local_58 + 0x10),
             (BBox1f)0x3f80000000000000,0);
  (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
  if ((long *)local_58._16_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._16_8_ + 0x18))();
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_positions","");
  XML::childOpt((XML *)&local_b0,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_b0.ptr == (XML *)0x0) {
    psVar2 = (string *)*local_60;
    pXVar1 = (XML *)(local_88 + 0x10);
    local_88._0_8_ = pXVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"positions","");
    uVar4 = local_58._8_8_;
    XML::childOpt((XML *)(local_88 + 0x30),psVar2);
    loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,
                    (Ref<embree::XML> *)(local_88 + 0x30));
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)(uVar4 + 0x70),
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               &local_a8);
    alignedFree((void *)local_a8.field_2._8_8_);
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8.field_2._8_8_ = (void *)0x0;
    if ((long *)local_58._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 0x18))();
    }
    if ((XML *)local_88._0_8_ != pXVar1) {
      operator_delete((void *)local_88._0_8_);
    }
    this_01 = (XML *)*local_60;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"positions2","");
    bVar5 = XML::hasChild(this_01,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (bVar5) {
      psVar2 = (string *)*local_60;
      local_88._0_8_ = pXVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"positions2","");
      XML::childOpt((XML *)(local_88 + 0x30),psVar2);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,
                      (Ref<embree::XML> *)(local_88 + 0x30));
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)(uVar4 + 0x70),
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
      if ((long *)local_58._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_58._0_8_ + 0x18))();
      }
      if ((XML *)local_88._0_8_ != pXVar1) {
        operator_delete((void *)local_88._0_8_);
      }
    }
  }
  else if (((local_b0.ptr)->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_finish !=
           ((local_b0.ptr)->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start) {
    this_00 = (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               *)(local_58._8_8_ + 0x70);
    uVar7 = 0;
    do {
      XML::child((XML *)local_88,(size_t)local_b0.ptr);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_88);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)this_00,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
      if ((XML *)local_88._0_8_ != (XML *)0x0) {
        (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)((local_b0.ptr)->children).
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)((local_b0.ptr)->children).
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  uVar4 = local_58._8_8_;
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_normals","");
  XML::childOpt((XML *)local_88,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((XML *)local_88._0_8_ == (XML *)0x0) {
    psVar2 = (string *)*local_60;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"normals","");
    XML::childOpt((XML *)&local_b0,psVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_b0.ptr != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      if (((element_type *)local_a8._M_string_length != (element_type *)0x0) &&
         ((((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *)(uVar4 + 0x70))->
          super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *)(uVar4 + 0x70))->
          super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start)) {
        uVar7 = 0;
        do {
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       *)(uVar4 + 0x88),(value_type *)&local_a8);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)(((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                          *)(uVar4 + 0x70))->
                                       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                          *)(uVar4 + 0x70))->
                                       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      alignedFree((void *)local_a8.field_2._8_8_);
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    if ((XML *)local_88._0_8_ == (XML *)0x0) goto LAB_0014817e;
  }
  else if ((((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            (local_88._0_8_ + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish !=
           (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            (local_88._0_8_ + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      XML::child((XML *)&local_b0,local_88._0_8_);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)(uVar4 + 0x88),
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)(local_88._0_8_ + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)(local_88._0_8_ + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))
            (local_88._0_8_);
LAB_0014817e:
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"texcoords","");
  uVar4 = local_58._8_8_;
  XML::childOpt((XML *)&local_b0,psVar2);
  loadVec2fArray((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_88,
                 (XMLLoader *)xml,&local_b0);
  pvVar3 = (((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)(uVar4 + 0xa0))->
           super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)(uVar4 + 0xa0))->
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = local_88._0_8_;
  (((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)(uVar4 + 0xa0))->
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
  (((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)(uVar4 + 0xa0))->
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if ((pvVar3 != (void *)0x0) && (operator_delete(pvVar3), (XML *)local_88._0_8_ != (XML *)0x0)) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"position_indices","");
  XML::childOpt((XML *)local_88,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(XMLLoader *)xml,
                  (Ref<embree::XML> *)local_88);
    pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xb8))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)
     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xb8))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data = local_a8._M_dataplus._M_p;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xb8))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)local_a8._M_string_length;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xb8))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)local_a8.field_2._M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    if ((pvVar3 != (void *)0x0) &&
       (operator_delete(pvVar3), local_a8._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    RVar6 = parseSubdivMode((Ref<embree::XML> *)local_88);
    *(RTCSubdivisionMode *)(uVar4 + 0x100) = RVar6;
    if ((XML *)local_88._0_8_ != (XML *)0x0) {
      (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
    }
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"normal_indices","");
  XML::childOpt((XML *)local_88,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(XMLLoader *)xml,
                  (Ref<embree::XML> *)local_88);
    pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xd0))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)
     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xd0))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data = local_a8._M_dataplus._M_p;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xd0))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)local_a8._M_string_length;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xd0))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)local_a8.field_2._M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    if ((pvVar3 != (void *)0x0) &&
       (operator_delete(pvVar3), local_a8._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    RVar6 = parseSubdivMode((Ref<embree::XML> *)local_88);
    *(RTCSubdivisionMode *)(uVar4 + 0x104) = RVar6;
    if ((XML *)local_88._0_8_ != (XML *)0x0) {
      (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
    }
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"texcoord_indices","");
  XML::childOpt((XML *)local_88,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(XMLLoader *)xml,
                  (Ref<embree::XML> *)local_88);
    pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xe8))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)
     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xe8))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data = local_a8._M_dataplus._M_p;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xe8))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)local_a8._M_string_length;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0xe8))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)local_a8.field_2._M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    if ((pvVar3 != (void *)0x0) &&
       (operator_delete(pvVar3), local_a8._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    RVar6 = parseSubdivMode((Ref<embree::XML> *)local_88);
    *(RTCSubdivisionMode *)(uVar4 + 0x108) = RVar6;
    if ((XML *)local_88._0_8_ != (XML *)0x0) {
      (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
    }
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"faces","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,(XMLLoader *)xml,
                &local_b0);
  pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x110))->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x110))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_88._0_8_;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x110))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_88._8_8_;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x110))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if ((pvVar3 != (void *)0x0) && (operator_delete(pvVar3), (XML *)local_88._0_8_ != (XML *)0x0)) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"holes","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,(XMLLoader *)xml,
                &local_b0);
  pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x128))->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x128))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_88._0_8_;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x128))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_88._8_8_;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x128))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if ((pvVar3 != (void *)0x0) && (operator_delete(pvVar3), (XML *)local_88._0_8_ != (XML *)0x0)) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"edge_creases","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadVec2iArray((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)local_88,
                 (XMLLoader *)xml,&local_b0);
  pvVar3 = (((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)(uVar4 + 0x140))->
           super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)(uVar4 + 0x140))->
  super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = local_88._0_8_;
  (((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)(uVar4 + 0x140))->
  super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
  (((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)(uVar4 + 0x140))->
  super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if ((pvVar3 != (void *)0x0) && (operator_delete(pvVar3), (XML *)local_88._0_8_ != (XML *)0x0)) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"edge_crease_weights","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadFloatArray((vector<float,_std::allocator<float>_> *)local_88,(XMLLoader *)xml,&local_b0);
  pvVar3 = (((vector<float,_std::allocator<float>_> *)(uVar4 + 0x158))->
           super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  (((vector<float,_std::allocator<float>_> *)(uVar4 + 0x158))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_start =
       local_88._0_8_;
  (((vector<float,_std::allocator<float>_> *)(uVar4 + 0x158))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_88._8_8_;
  (((vector<float,_std::allocator<float>_> *)(uVar4 + 0x158))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if ((pvVar3 != (void *)0x0) && (operator_delete(pvVar3), (XML *)local_88._0_8_ != (XML *)0x0)) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"vertex_creases","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,(XMLLoader *)xml,
                &local_b0);
  pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x170))->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x170))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_88._0_8_;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x170))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_88._8_8_;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar4 + 0x170))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if ((pvVar3 != (void *)0x0) && (operator_delete(pvVar3), (XML *)local_88._0_8_ != (XML *)0x0)) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"vertex_crease_weights","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadFloatArray((vector<float,_std::allocator<float>_> *)local_88,(XMLLoader *)xml,&local_b0);
  pvVar3 = (((vector<float,_std::allocator<float>_> *)(uVar4 + 0x188))->
           super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  (((vector<float,_std::allocator<float>_> *)(uVar4 + 0x188))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_start =
       local_88._0_8_;
  (((vector<float,_std::allocator<float>_> *)(uVar4 + 0x188))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_88._8_8_;
  (((vector<float,_std::allocator<float>_> *)(uVar4 + 0x188))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  sig = extraout_RDX;
  if ((pvVar3 != (void *)0x0) &&
     (operator_delete(pvVar3), sig = extraout_RDX_00, (XML *)local_88._0_8_ != (XML *)0x0)) {
    operator_delete((void *)local_88._0_8_);
    sig = extraout_RDX_01;
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
    sig = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
    sig = extraout_RDX_03;
  }
  SceneGraph::SubdivMeshNode::verify
            ((SubdivMeshNode *)uVar4,(EVP_PKEY_CTX *)xml,sig,in_RCX,in_R8,in_R9);
  (local_38->path).filename._M_dataplus._M_p = (pointer)uVar4;
  (**(code **)((long)(((Node *)uVar4)->super_RefCount)._vptr_RefCount + 0x10))(uVar4);
  (**(code **)((long)(((Node *)uVar4)->super_RefCount)._vptr_RefCount + 0x18))(uVar4);
  if ((long *)local_58._24_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._24_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)local_38;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadSubdivMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions2")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
    
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    if (Ref<XML> child = xml->childOpt("position_indices")) {
      mesh->position_indices = loadUIntArray(child);
      mesh->position_subdiv_mode = parseSubdivMode(child);
    }
    if (Ref<XML> child = xml->childOpt("normal_indices")) {
      mesh->normal_indices   = loadUIntArray(child);
      mesh->normal_subdiv_mode = parseSubdivMode(child);
    }
    if (Ref<XML> child = xml->childOpt("texcoord_indices")) {
      mesh->texcoord_indices = loadUIntArray(child);
      mesh->texcoord_subdiv_mode = parseSubdivMode(child);
    }

    mesh->verticesPerFace  = loadUIntArray(xml->childOpt("faces"));
    mesh->holes            = loadUIntArray(xml->childOpt("holes"));
    mesh->edge_creases     = loadVec2iArray(xml->childOpt("edge_creases"));
    mesh->edge_crease_weights = loadFloatArray(xml->childOpt("edge_crease_weights"));
    mesh->vertex_creases      = loadUIntArray(xml->childOpt("vertex_creases"));
    mesh->vertex_crease_weights = loadFloatArray(xml->childOpt("vertex_crease_weights"));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }